

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClaus.c
# Opt level: O3

void transpose32a(uint *a)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  unsigned_long m;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  
  uVar4 = 0xffff;
  uVar2 = 0x10;
  do {
    uVar5 = 0;
    do {
      uVar3 = uVar5 | uVar2;
      uVar6 = (a[(int)uVar3] >> (sbyte)uVar2 ^ a[(int)uVar5]) & (uint)uVar4;
      a[(int)uVar5] = uVar6 ^ a[(int)uVar5];
      a[(int)uVar3] = a[(int)uVar3] ^ uVar6 << (sbyte)uVar2;
      uVar5 = uVar3 + 1 & ~uVar2;
    } while ((int)uVar5 < 0x20);
    uVar4 = uVar4 ^ uVar4 << (sbyte)(uVar2 >> 1);
    bVar1 = 1 < uVar2;
    uVar2 = uVar2 >> 1;
  } while (bVar1);
  return;
}

Assistant:

void transpose32a( unsigned a[32] ) 
{
    int j, k;
    unsigned long m, t;
    for ( j = 16, m = 0x0000FFFF; j; j >>= 1, m ^= m << j ) 
    {
        for ( k = 0; k < 32; k = ((k | j) + 1) & ~j ) 
        {
            t = (a[k] ^ (a[k|j] >> j)) & m;
            a[k] ^= t;
            a[k|j] ^= (t << j);
        }
    }
}